

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O1

void __thiscall DCanvas::DrawBlock(DCanvas *this,int x,int y,int _width,int _height,BYTE *src)

{
  int iVar1;
  bool bVar2;
  BYTE *__src;
  int iVar3;
  BYTE *__dest;
  size_t __n;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  BYTE *local_38;
  
  local_48 = _height;
  local_44 = _width;
  local_40 = y;
  local_3c = x;
  local_38 = src;
  bVar2 = ClipBox(this,&local_3c,&local_40,&local_44,&local_48,&local_38,_width);
  if (!bVar2) {
    iVar1 = this->Pitch;
    __dest = this->Buffer + (long)local_3c + (long)local_40 * (long)iVar1;
    __n = (size_t)local_44;
    __src = local_38;
    iVar3 = local_48;
    do {
      memcpy(__dest,__src,__n);
      __src = __src + _width;
      __dest = __dest + iVar1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void DCanvas::DrawBlock (int x, int y, int _width, int _height, const BYTE *src) const
{
	int srcpitch = _width;
	int destpitch;
	BYTE *dest;

	if (ClipBox (x, y, _width, _height, src, srcpitch))
	{
		return;		// Nothing to draw
	}

	destpitch = Pitch;
	dest = Buffer + y*Pitch + x;

	do
	{
		memcpy (dest, src, _width);
		src += srcpitch;
		dest += destpitch;
	} while (--_height);
}